

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts5ParseError(Fts5Parse *pParse,char *zFmt,...)

{
  long lVar1;
  char *pcVar2;
  char *in_RCX;
  __va_list_tag *in_RDX;
  long in_RDI;
  long in_FS_OFFSET;
  va_list ap;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(in_RDI + 0x10) == 0) {
    pcVar2 = sqlite3_vmprintf(in_RCX,in_RDX);
    *(char **)(in_RDI + 8) = pcVar2;
    *(undefined4 *)(in_RDI + 0x10) = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void sqlite3Fts5ParseError(Fts5Parse *pParse, const char *zFmt, ...){
  va_list ap;
  va_start(ap, zFmt);
  if( pParse->rc==SQLITE_OK ){
    assert( pParse->zErr==0 );
    pParse->zErr = sqlite3_vmprintf(zFmt, ap);
    pParse->rc = SQLITE_ERROR;
  }
  va_end(ap);
}